

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O3

vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> * __thiscall
timing_registry::collectChildren
          (vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
           *__return_storage_ptr__,timing_registry *this,
          vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *children,
          double *totalDuration)

{
  pointer ptVar1;
  iterator iVar2;
  task_handle *c;
  pointer this_00;
  task_uid local_40;
  task_info *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>::reserve
            (__return_storage_ptr__,
             (long)(children->
                   super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(children->
                   super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4);
  *totalDuration = 0.0;
  this_00 = (children->super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (children->super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != ptVar1) {
    do {
      oqpi::task_handle::validate(this_00);
      local_40 = ((this_00->spTask_).super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->uid_;
      iVar2 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_timing_registry::task_info>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->tasks)._M_h,&local_40);
      local_38 = (task_info *)
                 ((long)iVar2.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_timing_registry::task_info>,_false>
                        ._M_cur + 0x10);
      std::vector<timing_registry::task_info*,std::allocator<timing_registry::task_info*>>::
      emplace_back<timing_registry::task_info*>
                ((vector<timing_registry::task_info*,std::allocator<timing_registry::task_info*>> *)
                 __return_storage_ptr__,&local_38);
      *totalDuration =
           (__return_storage_ptr__->
           super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
           )._M_impl.super__Vector_impl_data._M_finish[-1]->duration_ + *totalDuration;
      this_00 = this_00 + 1;
    } while (this_00 != ptVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<task_info*> collectChildren(const std::vector<oqpi::task_handle> &children, double &totalDuration)
    {
        std::vector<task_info*> infos;
        infos.reserve(children.size());
        totalDuration = 0;
        for (auto &c : children)
        {
            infos.push_back(&tasks.find(c.getUID())->second);
            totalDuration += infos.back()->duration_;
        }
        return infos;
    }